

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txindex.cpp
# Opt level: O1

bool __thiscall
TxIndex::FindTx(TxIndex *this,uint256 *tx_hash,uint256 *block_hash,CTransactionRef *tx)

{
  element_type *peVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  long in_FS_OFFSET;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  AutoFile file;
  CDiskTxPos postx;
  CBlockHeader header;
  Level in_stack_ffffffffffffff28;
  Level level;
  uint *args_5;
  char *in_stack_ffffffffffffff30;
  FILE *in_stack_ffffffffffffff38;
  CDiskTxPos local_a4;
  undefined1 local_98 [16];
  uchar local_88 [8];
  uchar auStack_80 [8];
  undefined1 local_78 [36];
  undefined1 local_54 [28];
  undefined1 local_38 [16];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_a4.super_FlatFilePos.nFile = -1;
  local_a4.super_FlatFilePos.nPos = 0;
  local_a4.nTxOffset = 0;
  local_78[0] = 't';
  local_78._1_8_ = *(undefined8 *)(tx_hash->super_base_blob<256U>).m_data._M_elems;
  uVar2 = *(undefined8 *)((tx_hash->super_base_blob<256U>).m_data._M_elems + 8);
  local_78._17_8_ = *(undefined8 *)((tx_hash->super_base_blob<256U>).m_data._M_elems + 0x10);
  uVar3 = *(undefined8 *)((tx_hash->super_base_blob<256U>).m_data._M_elems + 0x18);
  local_78._9_7_ = (undefined7)uVar2;
  local_78[0x10] = (uchar)((ulong)uVar2 >> 0x38);
  local_78._25_7_ = (undefined7)uVar3;
  local_78[0x20] = (uchar)((ulong)uVar3 >> 0x38);
  bVar4 = CDBWrapper::Read<std::pair<unsigned_char,uint256>,CDiskTxPos>
                    ((CDBWrapper *)
                     (this->m_db)._M_t.
                     super___uniq_ptr_impl<TxIndex::DB,_std::default_delete<TxIndex::DB>_>._M_t.
                     super__Tuple_impl<0UL,_TxIndex::DB_*,_std::default_delete<TxIndex::DB>_>.
                     super__Head_base<0UL,_TxIndex::DB_*,_false>._M_head_impl,
                     (pair<unsigned_char,_uint256> *)local_78,&local_a4);
  if (!bVar4) {
    bVar4 = false;
    goto LAB_0049d1cf;
  }
  ::node::BlockManager::OpenBlockFile
            ((AutoFile *)&stack0xffffffffffffff38,((this->super_BaseIndex).m_chainstate)->m_blockman
             ,&local_a4.super_FlatFilePos,true);
  if (in_stack_ffffffffffffff38 == (FILE *)0x0) {
    logging_function_00._M_str = "FindTx";
    logging_function_00._M_len = 6;
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/index/txindex.cpp"
    ;
    source_file_00._M_len = 0x5a;
    LogPrintf_<char[7]>(logging_function_00,source_file_00,0x54,
                        IPC|MEMPOOLREJ|PRUNE|CMPCTBLOCK|SELECTCOINS|ADDRMAN|ESTIMATEFEE|RPC|WALLETDB
                        |ZMQ|MEMPOOL|TOR|NET,in_stack_ffffffffffffff28,in_stack_ffffffffffffff30,
                        (char (*) [7])0x0);
LAB_0049d1c3:
    bVar4 = false;
  }
  else {
    local_38 = (undefined1  [16])0x0;
    local_54._12_16_ = (undefined1  [16])0x0;
    local_78[0x20] = '\0';
    stack0xffffffffffffffa9 = SUB1615((undefined1  [16])0x0,1);
    local_78[0x10] = '\0';
    local_78[0x11] = '\0';
    local_78[0x12] = '\0';
    local_78[0x13] = '\0';
    local_78[0x14] = '\0';
    local_78[0x15] = '\0';
    local_78[0x16] = '\0';
    local_78[0x17] = '\0';
    local_78[0x18] = '\0';
    local_78[0x19] = '\0';
    local_78[0x1a] = '\0';
    local_78[0x1b] = '\0';
    local_78[0x1c] = '\0';
    local_78[0x1d] = '\0';
    local_78[0x1e] = '\0';
    local_78[0x1f] = '\0';
    local_78[0] = '\0';
    local_78[1] = '\0';
    local_78[2] = '\0';
    local_78[3] = '\0';
    local_78[4] = '\0';
    local_78[5] = '\0';
    local_78[6] = '\0';
    local_78[7] = '\0';
    local_78[8] = '\0';
    local_78[9] = '\0';
    local_78[10] = '\0';
    local_78[0xb] = '\0';
    local_78[0xc] = '\0';
    local_78[0xd] = '\0';
    local_78[0xe] = '\0';
    local_78[0xf] = '\0';
    args_5 = (uint *)(local_38 + 0xc);
    ActionUnserialize::
    SerReadWriteMany<AutoFile,int&,uint256&,uint256&,unsigned_int&,unsigned_int&,unsigned_int&>
              ((AutoFile *)&stack0xffffffffffffff38,(int *)local_78,(uint256 *)(local_78 + 4),
               (uint256 *)local_54,(uint *)(local_38 + 4),(uint *)(local_38 + 8),args_5);
    level = (Level)args_5;
    iVar5 = fseek(in_stack_ffffffffffffff38,(ulong)local_a4.nTxOffset,1);
    if (iVar5 != 0) {
      logging_function._M_str = "FindTx";
      logging_function._M_len = 6;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/index/txindex.cpp"
      ;
      source_file._M_len = 0x5a;
      LogPrintf_<char[7]>(logging_function,source_file,0x5b,
                          IPC|COINDB|MEMPOOLREJ|PRUNE|RAND|REINDEX|ADDRMAN|ESTIMATEFEE|RPC|WALLETDB|
                          ZMQ,level,in_stack_ffffffffffffff30,
                          (char (*) [7])in_stack_ffffffffffffff38);
      goto LAB_0049d1c3;
    }
    local_98._0_8_ = &::TX_WITH_WITNESS;
    local_98._8_8_ = (AutoFile *)&stack0xffffffffffffff38;
    Unserialize<ParamsStream<AutoFile&,TransactionSerParams>,CTransaction>
              ((ParamsStream<AutoFile_&,_TransactionSerParams> *)local_98,tx);
    peVar1 = (tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    auVar7[0] = -((tx_hash->super_base_blob<256U>).m_data._M_elems[0] ==
                 (peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0]);
    auVar7[1] = -((tx_hash->super_base_blob<256U>).m_data._M_elems[1] ==
                 *(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 1
                           ));
    auVar7[2] = -((tx_hash->super_base_blob<256U>).m_data._M_elems[2] ==
                 *(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 2
                           ));
    auVar7[3] = -((tx_hash->super_base_blob<256U>).m_data._M_elems[3] ==
                 *(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 3
                           ));
    auVar7[4] = -((tx_hash->super_base_blob<256U>).m_data._M_elems[4] ==
                 *(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 4
                           ));
    auVar7[5] = -((tx_hash->super_base_blob<256U>).m_data._M_elems[5] ==
                 *(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 5
                           ));
    auVar7[6] = -((tx_hash->super_base_blob<256U>).m_data._M_elems[6] ==
                 *(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 6
                           ));
    auVar7[7] = -((tx_hash->super_base_blob<256U>).m_data._M_elems[7] ==
                 *(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 7
                           ));
    auVar7[8] = -((tx_hash->super_base_blob<256U>).m_data._M_elems[8] ==
                 *(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8
                           ));
    auVar7[9] = -((tx_hash->super_base_blob<256U>).m_data._M_elems[9] ==
                 *(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 9
                           ));
    auVar7[10] = -((tx_hash->super_base_blob<256U>).m_data._M_elems[10] ==
                  *(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                            10));
    auVar7[0xb] = -((tx_hash->super_base_blob<256U>).m_data._M_elems[0xb] ==
                   *(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                             0xb));
    auVar7[0xc] = -((tx_hash->super_base_blob<256U>).m_data._M_elems[0xc] ==
                   *(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                             0xc));
    auVar7[0xd] = -((tx_hash->super_base_blob<256U>).m_data._M_elems[0xd] ==
                   *(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                             0xd));
    auVar7[0xe] = -((tx_hash->super_base_blob<256U>).m_data._M_elems[0xe] ==
                   *(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                             0xe));
    auVar7[0xf] = -((tx_hash->super_base_blob<256U>).m_data._M_elems[0xf] ==
                   *(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                             0xf));
    auVar6[0] = -((tx_hash->super_base_blob<256U>).m_data._M_elems[0x10] ==
                 *(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                           0x10));
    auVar6[1] = -((tx_hash->super_base_blob<256U>).m_data._M_elems[0x11] ==
                 *(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                           0x11));
    auVar6[2] = -((tx_hash->super_base_blob<256U>).m_data._M_elems[0x12] ==
                 *(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                           0x12));
    auVar6[3] = -((tx_hash->super_base_blob<256U>).m_data._M_elems[0x13] ==
                 *(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                           0x13));
    auVar6[4] = -((tx_hash->super_base_blob<256U>).m_data._M_elems[0x14] ==
                 *(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                           0x14));
    auVar6[5] = -((tx_hash->super_base_blob<256U>).m_data._M_elems[0x15] ==
                 *(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                           0x15));
    auVar6[6] = -((tx_hash->super_base_blob<256U>).m_data._M_elems[0x16] ==
                 *(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                           0x16));
    auVar6[7] = -((tx_hash->super_base_blob<256U>).m_data._M_elems[0x17] ==
                 *(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                           0x17));
    auVar6[8] = -((tx_hash->super_base_blob<256U>).m_data._M_elems[0x18] ==
                 *(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                           0x18));
    auVar6[9] = -((tx_hash->super_base_blob<256U>).m_data._M_elems[0x19] ==
                 *(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                           0x19));
    auVar6[10] = -((tx_hash->super_base_blob<256U>).m_data._M_elems[0x1a] ==
                  *(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                            0x1a));
    auVar6[0xb] = -((tx_hash->super_base_blob<256U>).m_data._M_elems[0x1b] ==
                   *(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                             0x1b));
    auVar6[0xc] = -((tx_hash->super_base_blob<256U>).m_data._M_elems[0x1c] ==
                   *(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                             0x1c));
    auVar6[0xd] = -((tx_hash->super_base_blob<256U>).m_data._M_elems[0x1d] ==
                   *(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                             0x1d));
    auVar6[0xe] = -((tx_hash->super_base_blob<256U>).m_data._M_elems[0x1e] ==
                   *(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                             0x1e));
    auVar6[0xf] = -((tx_hash->super_base_blob<256U>).m_data._M_elems[0x1f] ==
                   *(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                             0x1f));
    auVar6 = auVar6 & auVar7;
    if ((ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) | (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar6[0xf] >> 7) << 0xf) != 0xffff) {
      logging_function_01._M_str = "FindTx";
      logging_function_01._M_len = 6;
      source_file_01._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/index/txindex.cpp"
      ;
      source_file_01._M_len = 0x5a;
      LogPrintf_<char[7]>(logging_function_01,source_file_01,100,
                          IPC|COINDB|MEMPOOLREJ|PRUNE|RAND|REINDEX|SELECTCOINS|BENCH|HTTP|TOR,level,
                          in_stack_ffffffffffffff30,(char (*) [7])in_stack_ffffffffffffff38);
      goto LAB_0049d1c3;
    }
    CBlockHeader::GetHash((uint256 *)local_98,(CBlockHeader *)local_78);
    *(uchar (*) [8])((block_hash->super_base_blob<256U>).m_data._M_elems + 0x10) = local_88;
    *(uchar (*) [8])((block_hash->super_base_blob<256U>).m_data._M_elems + 0x18) = auStack_80;
    *(undefined8 *)(block_hash->super_base_blob<256U>).m_data._M_elems = local_98._0_8_;
    *(undefined8 *)((block_hash->super_base_blob<256U>).m_data._M_elems + 8) = local_98._8_8_;
    bVar4 = true;
  }
  AutoFile::~AutoFile((AutoFile *)&stack0xffffffffffffff38);
LAB_0049d1cf:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool TxIndex::FindTx(const uint256& tx_hash, uint256& block_hash, CTransactionRef& tx) const
{
    CDiskTxPos postx;
    if (!m_db->ReadTxPos(tx_hash, postx)) {
        return false;
    }

    AutoFile file{m_chainstate->m_blockman.OpenBlockFile(postx, true)};
    if (file.IsNull()) {
        LogError("%s: OpenBlockFile failed\n", __func__);
        return false;
    }
    CBlockHeader header;
    try {
        file >> header;
        if (fseek(file.Get(), postx.nTxOffset, SEEK_CUR)) {
            LogError("%s: fseek(...) failed\n", __func__);
            return false;
        }
        file >> TX_WITH_WITNESS(tx);
    } catch (const std::exception& e) {
        LogError("%s: Deserialize or I/O error - %s\n", __func__, e.what());
        return false;
    }
    if (tx->GetHash() != tx_hash) {
        LogError("%s: txid mismatch\n", __func__);
        return false;
    }
    block_hash = header.GetHash();
    return true;
}